

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O1

event_process_result __thiscall
afsm::transitions::
state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def,_std::atomic<unsigned_long>_>
::process_transition_event<afsm::test::events::no_data>
          (state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def,_std::atomic<unsigned_long>_>
           *this,no_data *event)

{
  __int_type _Var1;
  event_process_result eVar2;
  transition_table_type<afsm::test::events::no_data> *ptVar3;
  indexes_tuple<0UL,_1UL,_2UL,_3UL,_4UL,_5UL> local_11;
  
  ptVar3 = state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def,std::atomic<unsigned_long>>
           ::transition_table<afsm::test::events::no_data,0ul,1ul,2ul,3ul,4ul,5ul>(&local_11);
  _Var1 = (this->current_state_).super___atomic_base<unsigned_long>._M_i;
  if (ptVar3->_M_elems[_Var1].super__Function_base._M_manager != (_Manager_type)0x0) {
    eVar2 = (**(code **)(((_Any_data *)(ptVar3->_M_elems + _Var1))->_M_pod_data + 0x18))
                      ((_Any_data *)(ptVar3->_M_elems + _Var1),this,event);
    return eVar2;
  }
  std::__throw_bad_function_call();
}

Assistant:

actions::event_process_result
    process_transition_event(Event&& event)
    {
        auto const& inv_table = transition_table<Event>( state_indexes{} );
        return inv_table[current_state()](*this, ::std::forward<Event>(event));
    }